

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O1

bool fs_set_cwd(string_view path)

{
  string_view path_00;
  int iVar1;
  char *in_RSI;
  size_t in_RDI;
  string_view fname;
  error_code ec;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  error_code local_50;
  path local_40;
  
  local_50._M_value = 0;
  local_60._M_len = in_RDI;
  local_60._M_str = in_RSI;
  local_50._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_40,&local_60,auto_format);
  std::filesystem::current_path(&local_40,&local_50);
  std::filesystem::__cxx11::path::~path(&local_40);
  iVar1 = local_50._M_value;
  if (local_50._M_value != 0) {
    path_00._M_str = local_60._M_str;
    path_00._M_len = local_60._M_len;
    fname._M_str = "fs_set_cwd";
    fname._M_len = 10;
    fs_print_error(path_00,fname,&local_50);
  }
  return iVar1 == 0;
}

Assistant:

bool fs_set_cwd(std::string_view path)
{

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  std::filesystem::current_path(path, ec);
  if(!ec) FFS_LIKELY
    return true;
#elif defined(_WIN32)
  // windows.h https://learn.microsoft.com/en-us/windows/win32/api/winbase/nf-winbase-setcurrentdirectory
  if(SetCurrentDirectoryA(path.data()))  FFS_LIKELY
    return true;
#else
  // unistd.h https://www.man7.org/linux/man-pages/man2/chdir.2.html
  if(chdir(path.data()) == 0)  FFS_LIKELY
    return true;
#endif

  fs_print_error(path, __func__, ec);
  return false;
}